

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

bool __thiscall
Memory::HeapBlockMap32::
RescanHeapBlockOnOOM<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
          (HeapBlockMap32 *this,SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *heapBlock,
          char *pageAddress,HeapBlockType blockType,uint bucketIndex,L2MapChunk *chunk,
          Recycler *recycler)

{
  code *pcVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  BVStatic<256UL> *heapBlockMarkBits;
  ulong uVar6;
  ulong uVar7;
  char *blockStartAddress;
  
  if (heapBlock == (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x46d,"(heapBlock != nullptr)","heapBlock != nullptr");
    if (!bVar3) goto LAB_0062f0a5;
    *puVar5 = 0;
  }
  if ((heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).super_HeapBlock.
      heapBlockType != blockType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x46e,"(heapBlock->GetHeapBlockType() == blockType)",
                       "heapBlock->GetHeapBlockType() == blockType");
    if (!bVar3) goto LAB_0062f0a5;
    *puVar5 = 0;
  }
  heapBlockMarkBits =
       GetMarkBitVectorForPages<256ul>
                 (this,(heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).
                       super_HeapBlock.address);
  blockStartAddress = (char *)((ulong)pageAddress & 0xfffffffffffff000);
  if (blockStartAddress != pageAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x474,"(blockStartAddress == pageAddress)",
                       "blockStartAddress == pageAddress");
    if (!bVar3) {
LAB_0062f0a5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  uVar4 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetPageCount
                    (&heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>);
  uVar7 = 0;
  uVar2 = 0;
  if (0 < (int)uVar4) {
    uVar7 = (ulong)uVar4;
  }
  do {
    uVar6 = uVar2;
    if (uVar6 == uVar7) {
      this->anyHeapBlockRescannedDuringOOM = true;
      break;
    }
    bVar3 = SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
            ::RescanObjectsOnPage
                      (heapBlock,blockStartAddress + (uint)((int)uVar6 << 0xc),blockStartAddress,
                       heapBlockMarkBits,bucketIndex * 0x10 + 0x10,bucketIndex,(bool *)0x0,recycler)
    ;
    if (!bVar3) {
      HeapBlock::SetNeedOOMRescan((HeapBlock *)heapBlock,recycler);
    }
    bVar3 = Recycler::NeedOOMRescan(recycler);
    uVar2 = uVar6 + 1;
  } while (!bVar3);
  return (long)(int)uVar4 <= (long)uVar6;
}

Assistant:

bool
HeapBlockMap32::RescanHeapBlockOnOOM(TBlockType* heapBlock, char* pageAddress, HeapBlock::HeapBlockType blockType, uint bucketIndex, L2MapChunk * chunk, Recycler * recycler)
{
    // In the OOM codepath, we expect the heap block to be dereferenced since perf is not critical
    Assert(heapBlock != nullptr);
    Assert(heapBlock->GetHeapBlockType() == blockType);
    auto markBits = this->GetMarkBitVectorForPages<TBlockType::HeapBlockAttributes::BitVectorCount>(heapBlock->GetAddress());
    char* blockStartAddress = TBlockType::GetBlockStartAddress(pageAddress);

    // Rescan all pages in this block
    // The following assert makes sure that this method is called only once per heap block
    Assert(blockStartAddress == pageAddress);

    int inUsePageCount = heapBlock->GetPageCount() - heapBlock->GetUnusablePageCount();
    for (int i = 0; i < inUsePageCount; i++)
    {
        char* pageAddressToScan = blockStartAddress + (i * AutoSystemInfo::PageSize);

        if (!SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(heapBlock,
            pageAddressToScan, blockStartAddress, markBits, HeapInfo::template GetObjectSizeForBucketIndex<typename TBlockType::HeapBlockAttributes>(bucketIndex), bucketIndex, nullptr, recycler))
        {
            // Failed due to OOM
            ((TBlockType*)heapBlock)->SetNeedOOMRescan(recycler);
        }

        if (recycler->NeedOOMRescan())
        {
            // We hit OOM again.  Don't try to process any more blocks, leave them for the next OOM pass.
            return false;
        }
    }

    this->anyHeapBlockRescannedDuringOOM = true;

    return true;
}